

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_stg.c
# Opt level: O1

int cvNlsFPFunctionSensStg(N_Vector ycorStg,N_Vector resStg,void *cvode_mem)

{
  N_Vector *fScur;
  int iVar1;
  long lVar2;
  int iVar3;
  
  if (cvode_mem == (void *)0x0) {
    iVar3 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x1b0,"cvNlsFPFunctionSensStg",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    fScur = *resStg->content;
    iVar1 = N_VLinearSumVectorArray
                      (0x3ff0000000000000,0x3ff0000000000000,*(undefined4 *)((long)cvode_mem + 0x90)
                       ,*(undefined8 *)((long)cvode_mem + 0x288),*ycorStg->content,
                       *(undefined8 *)((long)cvode_mem + 0x2f8));
    iVar3 = -0x1c;
    if (iVar1 == 0) {
      iVar1 = cvSensRhsWrapper((CVodeMem)cvode_mem,*(sunrealtype *)((long)cvode_mem + 0x408),
                               *(N_Vector *)((long)cvode_mem + 0x1c0),
                               *(N_Vector *)((long)cvode_mem + 0x1d8),
                               *(N_Vector **)((long)cvode_mem + 0x2f8),fScur,
                               *(N_Vector *)((long)cvode_mem + 0x1e0),
                               *(N_Vector *)((long)cvode_mem + 0x1e8));
      if (iVar1 < 0) {
        iVar3 = -0x29;
      }
      else {
        iVar3 = 0xf;
        if (iVar1 == 0) {
          if (*(int *)((long)cvode_mem + 0x90) < 1) {
            iVar3 = 0;
          }
          else {
            iVar3 = 0;
            lVar2 = 0;
            do {
              N_VLinearSum(*(undefined8 *)((long)cvode_mem + 0x3e0),0xbff0000000000000,fScur[lVar2],
                           *(undefined8 *)(*(long *)((long)cvode_mem + 0x290) + lVar2 * 8),
                           fScur[lVar2]);
              N_VScale(*(undefined8 *)((long)cvode_mem + 0x520),fScur[lVar2],fScur[lVar2]);
              lVar2 = lVar2 + 1;
            } while (lVar2 < *(int *)((long)cvode_mem + 0x90));
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int cvNlsFPFunctionSensStg(N_Vector ycorStg, N_Vector resStg,
                                  void* cvode_mem)
{
  CVodeMem cv_mem;
  int retval, is;
  N_Vector *ycorS, *resS;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* extract sensitivity and residual vectors from the vector wrapper */
  ycorS = NV_VECS_SW(ycorStg);
  resS  = NV_VECS_SW(resStg);

  /* update the sensitivities based on the current correction */
  retval = N_VLinearSumVectorArray(cv_mem->cv_Ns, ONE, cv_mem->cv_znS[0], ONE,
                                   ycorS, cv_mem->cv_yS);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  /* evaluate the sensitivity rhs function */
  retval = cvSensRhsWrapper(cv_mem, cv_mem->cv_tn, cv_mem->cv_y,
                            cv_mem->cv_ftemp, cv_mem->cv_yS, resS,
                            cv_mem->cv_vtemp1, cv_mem->cv_vtemp2);

  if (retval < 0) { return (CV_SRHSFUNC_FAIL); }
  if (retval > 0) { return (SRHSFUNC_RECVR); }

  /* evaluate sensitivity fixed point function */
  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    N_VLinearSum(cv_mem->cv_h, resS[is], -ONE, cv_mem->cv_znS[1][is], resS[is]);
    N_VScale(cv_mem->cv_rl1, resS[is], resS[is]);
  }

  return (CV_SUCCESS);
}